

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O1

vector<char_*,_std::allocator<char_*>_> *
absl::ParseCommandLine
          (vector<char_*,_std::allocator<char_*>_> *__return_storage_ptr__,int argc,char **argv)

{
  pointer *pppcVar1;
  char **__args;
  char cVar2;
  iterator iVar3;
  char *pcVar4;
  void *pvVar5;
  size_t sVar6;
  long lVar7;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>_>_>
  *this;
  const_iterator cVar8;
  ostream *poVar9;
  undefined8 uVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *pcVar11;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *programname;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  vector<char*,std::allocator<char*>> *pvVar12;
  _Rb_tree_header *p_Var13;
  int iVar14;
  int iVar15;
  string arg;
  string value;
  string key;
  string local_c8;
  vector<char*,std::allocator<char*>> *local_a8;
  char **local_a0;
  int local_94;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  key_type local_70;
  long *local_50 [2];
  long local_40 [2];
  
  if (argc == 0) {
    (__return_storage_ptr__->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90 = &local_80;
  local_88 = 0;
  local_80 = 0;
  (__return_storage_ptr__->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8 = (vector<char*,std::allocator<char*>> *)__return_storage_ptr__;
  local_a0 = argv;
  std::vector<char_*,_std::allocator<char_*>_>::reserve(__return_storage_ptr__,(long)argc);
  iVar3._M_current =
       (__return_storage_ptr__->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (__return_storage_ptr__->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
              ((vector<char*,std::allocator<char*>> *)__return_storage_ptr__,iVar3,local_a0);
    pcVar11 = extraout_RDX_00;
  }
  else {
    *iVar3._M_current = *local_a0;
    pppcVar1 = &(__return_storage_ptr__->super__Vector_base<char_*,_std::allocator<char_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
    pcVar11 = extraout_RDX;
  }
  if (1 < argc) {
    iVar15 = 1;
    local_94 = argc;
    do {
      __args = local_a0 + iVar15;
      local_70._M_string_length = 0;
      *local_70._M_dataplus._M_p = '\0';
      local_88 = 0;
      *local_90 = 0;
      pcVar4 = *__args;
      cVar2 = *pcVar4;
      iVar14 = 1;
      if (cVar2 == '-') {
        pcVar11 = pcVar4 + 1;
        if (pcVar4[1] == '-') {
          pcVar11 = pcVar4 + 2;
        }
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        sVar6 = strlen(pcVar11);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,pcVar11,pcVar11 + sVar6)
        ;
        lVar7 = std::__cxx11::string::find((char *)&local_c8,0x348cdb,0);
        if (lVar7 == -1) {
          std::__cxx11::string::_M_assign((string *)&local_70);
          local_88 = 0;
          *local_90 = 0;
          iVar14 = 1;
          pcVar11 = extraout_RDX_03;
          if ((local_94 - iVar15 != 1) && (pcVar4 = __args[1], *pcVar4 != '-')) {
            strlen(pcVar4);
            iVar14 = 2;
            std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,(ulong)pcVar4);
            pcVar11 = extraout_RDX_04;
          }
        }
        else {
          std::__cxx11::string::substr((ulong)local_50,(ulong)&local_c8);
          std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          std::__cxx11::string::substr((ulong)local_50,(ulong)&local_c8);
          std::__cxx11::string::operator=((string *)&local_90,(string *)local_50);
          pcVar11 = extraout_RDX_01;
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
            pcVar11 = extraout_RDX_02;
          }
          iVar14 = 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          pcVar11 = extraout_RDX_05;
        }
      }
      if (cVar2 == '-') {
        this = &internal::(anonymous_namespace)::GetFlagMap_abi_cxx11_()->_M_t;
        cVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>_>_>
                ::find(this,&local_70);
        p_Var13 = &(this->_M_impl).super__Rb_tree_header;
        if ((_Rb_tree_header *)cVar8._M_node != p_Var13) {
          lVar7 = *(long *)(cVar8._M_node + 2);
          if (*(long *)(lVar7 + 0x48) == 0) {
            uVar10 = std::__throw_bad_function_call();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            pvVar5 = *(void **)local_a8;
            if (pvVar5 != (void *)0x0) {
              operator_delete(pvVar5,(long)*(pointer *)(local_a8 + 0x10) - (long)pvVar5);
            }
            if (local_90 != &local_80) {
              operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,
                              CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                       local_70.field_2._M_local_buf[0]) + 1);
            }
            _Unwind_Resume(uVar10);
          }
          (**(code **)(lVar7 + 0x50))(lVar7 + 0x38,&local_90);
          pcVar11 = extraout_RDX_06;
          if ((_Rb_tree_header *)cVar8._M_node != p_Var13) goto LAB_001c8a6f;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown/Invalid flag ",0x15);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_70._M_dataplus._M_p,
                            local_70._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n\n",2);
        internal::(anonymous_namespace)::PrintHelp_abi_cxx11_
                  (&local_c8,(_anonymous_namespace_ *)*local_a0,programname);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,local_c8._M_dataplus._M_p,local_c8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        sentencepiece::error::Exit(1);
        pcVar11 = extraout_RDX_07;
      }
      else {
        iVar3._M_current = *(char ***)(local_a8 + 8);
        if (iVar3._M_current == *(char ***)(local_a8 + 0x10)) {
          std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
                    (local_a8,iVar3,__args);
          pcVar11 = extraout_RDX_08;
        }
        else {
          *iVar3._M_current = *__args;
          *(long *)(local_a8 + 8) = *(long *)(local_a8 + 8) + 8;
        }
      }
LAB_001c8a6f:
      iVar15 = iVar15 + iVar14;
    } while (iVar15 < local_94);
  }
  pvVar12 = local_a8;
  if (FLAGS_help.value_ == false) {
    if (FLAGS_version.value_ != true) goto LAB_001c8b6c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sentencepiece",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0.2.1",5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    iVar15 = 0;
    std::ostream::flush();
  }
  else {
    internal::(anonymous_namespace)::PrintHelp_abi_cxx11_
              (&local_c8,(_anonymous_namespace_ *)*local_a0,pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_c8._M_dataplus._M_p,local_c8._M_string_length);
    pvVar12 = local_a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    iVar15 = 1;
  }
  sentencepiece::error::Exit(iVar15);
LAB_001c8b6c:
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return (vector<char_*,_std::allocator<char_*>_> *)pvVar12;
}

Assistant:

std::vector<char *> ParseCommandLine(int argc, char *argv[]) {
  if (argc == 0) return {};

  int used_argc = 0;
  std::string key, value;
  std::vector<char *> output_args;
  output_args.reserve(argc);
  output_args.push_back(argv[0]);

  auto set_flag = [](const std::string &name, const std::string &value) {
    const auto *flag_map = internal::GetFlagMap();
    auto it = flag_map->find(name);
    if (it == flag_map->end()) return false;
    it->second->set_value(value);
    return true;
  };

  for (int i = 1; i < argc; i += used_argc) {
    if (!internal::CommandLineGetFlag(argc - i, argv + i, &key, &value,
                                      &used_argc)) {
      output_args.push_back(argv[i]);
      continue;
    }

    if (!set_flag(key, value)) {
      std::cerr << "Unknown/Invalid flag " << key << "\n\n"
                << internal::PrintHelp(argv[0]);
      sentencepiece::error::Exit(1);
    }
  }

  if (absl::GetFlag(FLAGS_help)) {
    std::cout << internal::PrintHelp(argv[0]);
    sentencepiece::error::Exit(1);
  } else if (absl::GetFlag(FLAGS_version)) {
    std::cout << PACKAGE_STRING << " " << VERSION << std::endl;
    sentencepiece::error::Exit(0);
  }

  return output_args;
}